

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O0

void Bbl_ManTest(Abc_Ntk_t *pNtk)

{
  abctime aVar1;
  Bbl_Man_t *p_00;
  abctime aVar2;
  abctime aVar3;
  abctime aVar4;
  abctime aVar5;
  Bbl_Man_t *p_01;
  abctime aVar6;
  abctime aVar7;
  Abc_Ntk_t *pNtk_00;
  abctime aVar8;
  abctime aVar9;
  abctime aVar10;
  abctime clk5;
  abctime clk4;
  abctime clk3;
  abctime clk2;
  abctime clk1;
  abctime clk;
  char *pFileName;
  Bbl_Man_t *pNew;
  Bbl_Man_t *p;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  aVar1 = Abc_Clock();
  p_00 = Bbl_ManFromAbc(pNtk);
  Bbl_ManPrintStats(p_00);
  aVar2 = Abc_Clock();
  aVar3 = Abc_Clock();
  Bbl_ManDumpBinaryBlif(p_00,"test.bblif");
  aVar4 = Abc_Clock();
  aVar5 = Abc_Clock();
  p_01 = Bbl_ManReadBinaryBlif("test.bblif");
  Bbl_ManStop(p_00);
  aVar6 = Abc_Clock();
  aVar7 = Abc_Clock();
  pNtk_00 = Bbl_ManToAig(p_01);
  Bbl_ManStop(p_01);
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  Abc_NtkDelete(pNtk_00);
  aVar10 = Abc_Clock();
  printf("Runtime stats:\n");
  Abc_Print(1,"%s =","ABC to Man");
  Abc_Print(1,"%9.2f sec\n",((double)(aVar2 - aVar1) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Writing   ");
  Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar3) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Reading   ");
  Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Man to ABC");
  Abc_Print(1,"%9.2f sec\n",((double)(aVar8 - aVar7) * 1.0) / 1000000.0);
  Abc_Print(1,"%s =","Verify    ");
  Abc_Print(1,"%9.2f sec\n",((double)(aVar10 - aVar9) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Bbl_ManTest( Abc_Ntk_t * pNtk )
{
    extern Bbl_Man_t * Bbl_ManFromAbc( Abc_Ntk_t * pNtk );

    Abc_Ntk_t * pNtkNew;
    Bbl_Man_t * p, * pNew;
    char * pFileName = "test.bblif";
    abctime clk, clk1, clk2, clk3, clk4, clk5;
clk = Abc_Clock();
    p = Bbl_ManFromAbc( pNtk );
    Bbl_ManPrintStats( p );
clk1 = Abc_Clock() - clk;
//Bbl_ManDumpBlif( p, "test_bbl.blif" );

    // write into file and back
clk = Abc_Clock();
    Bbl_ManDumpBinaryBlif( p, pFileName );
clk2 = Abc_Clock() - clk;

    // read from file
clk = Abc_Clock();
    pNew = Bbl_ManReadBinaryBlif( pFileName );
    Bbl_ManStop( p ); p = pNew;
clk3 = Abc_Clock() - clk;

    // generate ABC network
clk = Abc_Clock();
    pNtkNew = Bbl_ManToAig( p );
//    pNtkNew = Bbl_ManToAbc( p );
    Bbl_ManStop( p );
clk4 = Abc_Clock() - clk;

    // equivalence check
clk = Abc_Clock();
//    Bbl_ManVerify( pNtk, pNtkNew );
    Abc_NtkDelete( pNtkNew );
clk5 = Abc_Clock() - clk;

printf( "Runtime stats:\n" );
ABC_PRT( "ABC to Man", clk1 );
ABC_PRT( "Writing   ", clk2 );
ABC_PRT( "Reading   ", clk3 );
ABC_PRT( "Man to ABC", clk4 );
ABC_PRT( "Verify    ", clk5 );
}